

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O1

int uv_tty_reset_mode(void)

{
  uv_spinlock_t uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  
  iVar4 = 0;
  LOCK();
  uVar1.lock = termios_spinlock.lock;
  if (termios_spinlock.lock == 0) {
    termios_spinlock.lock = 1;
    uVar1.lock = 0;
  }
  UNLOCK();
  iVar2 = -0x10;
  if (uVar1.lock == 0) {
    if (orig_termios_fd != -1) {
      iVar4 = 0;
      iVar2 = tcsetattr(orig_termios_fd,0,(termios *)&orig_termios);
      if (iVar2 != 0) {
        piVar3 = __errno_location();
        iVar4 = -*piVar3;
      }
    }
    termios_spinlock.lock = 0;
    iVar2 = iVar4;
  }
  return iVar2;
}

Assistant:

int uv_tty_reset_mode(void) {
  int err;

  if (!uv_spinlock_trylock(&termios_spinlock))
    return -EBUSY;  /* In uv_tty_set_mode(). */

  err = 0;
  if (orig_termios_fd != -1)
    if (tcsetattr(orig_termios_fd, TCSANOW, &orig_termios))
      err = -errno;

  uv_spinlock_unlock(&termios_spinlock);
  return err;
}